

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# t_prepro.cpp
# Opt level: O0

DFsSection * __thiscall DFsScript::NewSection(DFsScript *this,char *brace)

{
  int iVar1;
  int iVar2;
  DFsSection *this_00;
  char *len;
  DFsSection *newsec;
  int n;
  char *brace_local;
  DFsScript *this_local;
  
  len = brace;
  iVar1 = section_hash(this,brace);
  this_00 = (DFsSection *)DObject::operator_new((DObject *)0x40,(size_t)len);
  DFsSection::DFsSection(this_00);
  iVar2 = MakeIndex(this,brace);
  this_00->start_index = iVar2;
  (this_00->next).field_0 = this->sections[iVar1].field_0;
  TObjPtr<DFsSection>::operator=(this->sections + iVar1,this_00);
  GC::WriteBarrier(&this->super_DObject,(DObject *)this_00);
  return this_00;
}

Assistant:

DFsSection *DFsScript::NewSection(const char *brace)
{
	int n = section_hash(brace);
	DFsSection *newsec = new DFsSection;
	
	newsec->start_index = MakeIndex(brace);
	newsec->next = sections[n];
	sections[n] = newsec;
	GC::WriteBarrier(this, newsec);
	return newsec;
}